

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O0

int mk_sched_event_write(mk_sched_conn *conn,mk_sched_worker *sched,mk_server *server)

{
  mk_event *event;
  size_t count;
  mk_server *pmStack_28;
  int ret;
  mk_server *server_local;
  mk_sched_worker *sched_local;
  mk_sched_conn *conn_local;
  
  count._4_4_ = 0xffffffff;
  pmStack_28 = server;
  server_local = (mk_server *)sched;
  sched_local = (mk_sched_worker *)conn;
  count._4_4_ = mk_channel_write(&conn->channel,(size_t *)&event);
  if ((count._4_4_ == 4) || (count._4_4_ == 0x10)) {
    conn_local._4_4_ = 0;
  }
  else if ((count._4_4_ == 1) || (count._4_4_ == 8)) {
    if (*(long *)(*(long *)&sched_local->signal_channel_r + 0x18) != 0) {
      count._4_4_ = (**(code **)(*(long *)&sched_local->signal_channel_r + 0x18))
                              (sched_local,server_local,pmStack_28);
    }
    if (count._4_4_ == 0xffffffff) {
      conn_local._4_4_ = -1;
    }
    else {
      if (count._4_4_ == 0) {
        mk_event_add(*(mk_event_loop **)server_local,*(int *)&sched_local->loop,3,1,sched_local);
      }
      conn_local._4_4_ = 0;
    }
  }
  else if ((count._4_4_ & 2) == 0) {
    conn_local._4_4_ = -1;
  }
  else {
    conn_local._4_4_ = -1;
  }
  return conn_local._4_4_;
}

Assistant:

int mk_sched_event_write(struct mk_sched_conn *conn,
                         struct mk_sched_worker *sched,
                         struct mk_server *server)
{
    int ret = -1;
    size_t count;
    struct mk_event *event;

    MK_TRACE("[FD %i] Connection Handler / write", conn->event.fd);

    ret = mk_channel_write(&conn->channel, &count);
    if (ret == MK_CHANNEL_FLUSH || ret == MK_CHANNEL_BUSY) {
        return 0;
    }
    else if (ret == MK_CHANNEL_DONE || ret == MK_CHANNEL_EMPTY) {
        if (conn->protocol->cb_done) {
            ret = conn->protocol->cb_done(conn, sched, server);
        }
        if (ret == -1) {
            return -1;
        }
        else if (ret == 0) {
            event = &conn->event;
            mk_event_add(sched->loop, event->fd,
                         MK_EVENT_CONNECTION,
                         MK_EVENT_READ,
                         conn);
        }
        return 0;
    }
    else if (ret & MK_CHANNEL_ERROR) {
        return -1;
    }

    /* avoid to make gcc cry :_( */
    return -1;
}